

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

StandardCaseItemSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::StandardCaseItemSyntax,slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>&,slang::parsing::Token,slang::syntax::SyntaxNode&>
          (BumpAllocator *this,SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *args,
          Token *args_1,SyntaxNode *args_2)

{
  Token colon;
  StandardCaseItemSyntax *pSVar1;
  size_t in_RCX;
  BumpAllocator *in_RDX;
  SyntaxNode *unaff_retaddr;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *in_stack_00000008;
  StandardCaseItemSyntax *in_stack_00000010;
  size_t in_stack_ffffffffffffffd8;
  
  pSVar1 = (StandardCaseItemSyntax *)allocate(in_RDX,in_RCX,in_stack_ffffffffffffffd8);
  colon.info = (Info *)args_1;
  colon._0_8_ = args_2;
  slang::syntax::StandardCaseItemSyntax::StandardCaseItemSyntax
            (in_stack_00000010,in_stack_00000008,colon,unaff_retaddr);
  return pSVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }